

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

pair<const_int,_unsigned_long> * __thiscall
rangeless::fn::impl::maybe<std::pair<const_int,_unsigned_long>_>::operator*
          (maybe<std::pair<const_int,_unsigned_long>_> *this)

{
  if (this->m_empty != true) {
    return (pair<const_int,_unsigned_long> *)this;
  }
  __assert_fail("!m_empty",
                "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                ,199,
                "T &rangeless::fn::impl::maybe<std::pair<const int, unsigned long>>::operator*() [T = std::pair<const int, unsigned long>]"
               );
}

Assistant:

T& operator*() noexcept
        {
            assert(!m_empty);

#if __cplusplus >= 201703L
            return *std::launder(&m_value);
#else
            return m_value;
#endif
        }